

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O1

void __thiscall vmips::address::output(address *this,ostream *out)

{
  Status SVar1;
  
  SVar1 = ((this->data).super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->status;
  std::__ostream_insert<char,std::char_traits<char>>(out,"li ",3);
  operator<<(out,(this->super_Unary).target.
                 super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  if (SVar1 == Undetermined) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<stack_offset>",0xe);
    return;
  }
  std::ostream::_M_insert<unsigned_long>((ulong)out);
  return;
}

Assistant:

void address::output(std::ostream &out) const {
    if (data->status != MemoryLocation::Undetermined) {
        out << "li " << *this->target << ", " << data->offset;
    } else {
        out << "li " << *this->target << ", " << "<stack_offset>";
    }
}